

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astmem.cpp
# Opt level: O1

int main(int argc,char **argsv)

{
  int iVar1;
  ostream *poVar2;
  LanguageConfiguration cfg;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Parser parser;
  Logger log;
  Lexer lex;
  istringstream input;
  LanguageConfiguration local_31a;
  undefined1 local_318 [40];
  undefined1 local_2f0 [32];
  size_t sStack_2d0;
  _Rb_tree_node_base local_2c8;
  size_t local_2a8;
  Logger local_2a0;
  Lexer local_278;
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = 1;
  if ((argc == 2) && (*argsv[1] != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,argsv[1],(allocator<char> *)local_2f0);
    std::__cxx11::istringstream::istringstream(local_198,(string *)&local_278,_S_in);
    if ((istream **)local_278._vptr_Lexer != &local_278.input) {
      operator_delete(local_278._vptr_Lexer,(ulong)(local_278.input + 1));
    }
    local_31a.multiLineString = false;
    local_31a.multiLineStringLeftTrim = true;
    local_2f0._0_8_ = local_2f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"<args[1]>","");
    pfederc::Lexer::Lexer(&local_278,&local_31a,(istream *)local_198,(string *)local_2f0);
    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
    }
    pfederc::BaseLogger::BaseLogger
              ((BaseLogger *)local_2f0,(ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              (&local_2a0,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,
               (BaseLogger *)local_2f0);
    pfederc::BaseLogger::~BaseLogger((BaseLogger *)local_2f0);
    pfederc::Lexer::next(&local_278);
    local_2c8._M_left = &local_2c8;
    local_2f0._8_8_ = (_Base_ptr)0x0;
    local_2f0._16_8_ = 0;
    local_2f0._24_8_ = 0;
    sStack_2d0 = 0;
    local_2c8._M_color = _S_red;
    local_2c8._4_4_ = 0;
    local_2c8._M_parent = (_Base_ptr)0x0;
    local_2a8 = 0;
    local_2f0._0_8_ = &local_278;
    local_2c8._M_right = local_2c8._M_left;
    pfederc::Parser::parseExpression((Parser *)local_318,(Precedence)local_2f0);
    pfederc::logLexerErrors(&local_2a0,&local_278);
    if ((Lexer *)local_318._0_8_ == (Lexer *)0x0) {
      pfederc::logParserErrors(&local_2a0,(Parser *)local_2f0);
    }
    else {
      (*(*(_func_int ***)local_318._0_8_)[2])(local_318 + 8);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_318._8_8_,local_318._16_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((pointer)local_318._8_8_ != (pointer)(local_318 + 0x18)) {
        operator_delete((void *)local_318._8_8_,
                        (ulong)((long)&(((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                                          *)local_318._24_8_)->
                                       super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                                       )._M_t.
                                       super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                                       .
                                       super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>
                                       ._M_head_impl + 1));
      }
    }
    if ((Lexer *)local_318._0_8_ != (Lexer *)0x0) {
      (*(*(_func_int ***)local_318._0_8_)[1])();
    }
    pfederc::Parser::~Parser((Parser *)local_2f0);
    pfederc::Logger::~Logger(&local_2a0);
    pfederc::Lexer::~Lexer(&local_278);
    std::__cxx11::istringstream::~istringstream(local_198);
    std::ios_base::~ios_base(local_120);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char * argsv[]) {
  if (argc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(argsv[1]);
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");

  Logger log;
  
  lex.next();
  Parser parser(lex);
  auto expr = parser.parseExpression();

  logLexerErrors(log, lex);

  if (!expr) {
    logParserErrors(log, parser);
    return 0;
  }

  std::cout << expr->toString() << std::endl;

  return 0;
}